

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O2

void VectorTestMain(void)

{
  int iVar1;
  Vector *V;
  ostream *poVar2;
  Vector *V_00;
  Vector *pVVar3;
  int i;
  uint uVar4;
  ElementType EVar5;
  
  V = (Vector *)malloc(0x10);
  InitVector(V,10);
  for (uVar4 = 10; uVar4 < 0x33; uVar4 = uVar4 + 10) {
    Insert(V,uVar4,0);
  }
  std::operator<<((ostream *)&std::cout,"After initVector:");
  printOut(V);
  poVar2 = std::operator<<((ostream *)&std::cout,"The node(pos 3) is:");
  EVar5 = 0;
  if (3 < V->VectorLength) {
    EVar5 = V->elements[3];
  }
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,EVar5);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"The position of node 30 is:");
  iVar1 = Find(V,0x1e);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  Remove(V,2);
  std::operator<<((ostream *)&std::cout,"After removing the node(pos:2),the Vector is:");
  printOut(V);
  V_00 = (Vector *)malloc(0x10);
  InitVector(V_00,5);
  for (uVar4 = 10; uVar4 < 0x3d; uVar4 = uVar4 + 0x14) {
    Insert(V_00,uVar4,0);
  }
  std::operator<<((ostream *)&std::cout,"VectorA is:");
  printOut(V);
  std::operator<<((ostream *)&std::cout,"VectorB is:");
  printOut(V_00);
  std::operator<<((ostream *)&std::cout,"The Union of VectorA and VectorB is:");
  pVVar3 = Union(V,V_00);
  printOut(pVVar3);
  std::operator<<((ostream *)&std::cout,"The Intersection of VectorA and VectorB is:");
  pVVar3 = Intersection(V,V_00);
  printOut(pVVar3);
  FreeVector(V);
  FreeVector(V_00);
  return;
}

Assistant:

void VectorTestMain()
{
    Vector *V = (Vector *)malloc(sizeof(Vector));
    InitVector(V,10);
    for(int i = 10; i <= 50; i+=10)
        Insert(V,i,0);
    cout << "After initVector:";
    printOut(V);
    cout << "The node(pos 3) is:" << GetNode(V,3) << endl;
    cout << "The position of node 30 is:" << Find(V,30) << endl;
    Remove(V,2);
    cout << "After removing the node(pos:2),the Vector is:";
    printOut(V);
    Vector *tmp = (Vector *)malloc(sizeof(Vector));
    InitVector(tmp,5);
    for(int i = 10; i <= 60; i+=20)
        Insert(tmp,i,0);
    cout << "VectorA is:";
    printOut(V);
    cout << "VectorB is:";
    printOut(tmp);
    cout << "The Union of VectorA and VectorB is:";
    printOut(Union(V,tmp));
    cout << "The Intersection of VectorA and VectorB is:";
    printOut(Intersection(V,tmp));
    FreeVector(V);
    FreeVector(tmp);
}